

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testNativeFormat.cpp
# Opt level: O2

void anon_unknown.dwarf_211fd6::readCopyRead(string *tempDir,char *infilename,uint correctChecksum)

{
  short *psVar1;
  short *psVar2;
  Rgba RVar3;
  int iVar4;
  _Alloc_hider _Var5;
  int iVar6;
  int *piVar7;
  long lVar8;
  ostream *poVar9;
  undefined4 *puVar10;
  char *pcVar11;
  long lVar12;
  Rgba *pRVar13;
  Rgba *pRVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int x;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  undefined4 uVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  uint local_150;
  OutputFile file;
  Array2D<Imf_3_2::Rgba> pixels;
  Array2D<Imf_3_2::Rgba> pixels2;
  long local_e8;
  long local_e0;
  FrameBuffer frameBuffer_1;
  Header header;
  string outfilename;
  
  std::operator+(&outfilename,tempDir,"imf_test_native.exr");
  pixels._sizeX = 1;
  pixels._sizeY = 1;
  pixels._data = (Rgba *)operator_new__(8);
  std::operator<<((ostream *)&std::cout,"   reading, ");
  std::ostream::flush();
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&header,infilename,iVar6);
  piVar7 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  iVar6 = *piVar7;
  local_150 = (piVar7[2] - iVar6) + 1;
  iVar23 = piVar7[1];
  uVar17 = ((long)piVar7[3] - (long)iVar23) + 1;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase(&pixels,uVar17,(long)(int)local_150);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            ((Rgba *)&header,
             (ulong)(pixels._data + (-(long)iVar6 - (long)iVar23 * (long)(int)local_150)),1);
  lVar8 = Imf_3_2::RgbaInputFile::dataWindow();
  iVar6 = *(int *)(lVar8 + 4);
  Imf_3_2::RgbaInputFile::dataWindow();
  Imf_3_2::RgbaInputFile::readPixels((int)&header,iVar6);
  uVar15 = 0;
  uVar18 = 0;
  if (0 < (int)local_150) {
    uVar18 = (ulong)local_150;
  }
  uVar19 = 0;
  if (0 < (int)uVar17) {
    uVar19 = uVar17 & 0xffffffff;
  }
  uVar16 = 0;
  pRVar13 = pixels._data;
  for (; uVar15 != uVar19; uVar15 = uVar15 + 1) {
    for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
      RVar3 = pRVar13[uVar20];
      auVar27._8_8_ = 0;
      auVar27._0_2_ = RVar3.r._h;
      auVar27._2_2_ = RVar3.g._h;
      auVar27._4_2_ = RVar3.b._h;
      auVar27._6_2_ = RVar3.a._h;
      uVar28 = RVar3._4_4_;
      auVar29._4_4_ = uVar28;
      auVar29._0_4_ = uVar28;
      auVar29._8_4_ = uVar28;
      auVar29._12_4_ = uVar28;
      uVar16 = uVar16 ^ (ushort)(SUB162(auVar29 ^ auVar27,2) ^ SUB162(auVar29 ^ auVar27,0));
    }
    pRVar13 = pRVar13 + pixels._sizeY;
  }
  poVar9 = std::operator<<((ostream *)&std::cout,"checksum = ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::ostream::flush();
  if (uVar16 != correctChecksum) {
    __assert_fail("checksum == correctChecksum",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                  ,0x40,
                  "void (anonymous namespace)::readImage(const char *, Array2D<Rgba> &, int &, int &, unsigned int)"
                 );
  }
  std::operator<<((ostream *)&std::cout,", ok");
  std::ostream::flush();
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_e0 = -1;
  lVar8 = 8;
  lVar26 = 1;
  do {
    if (lVar26 == 3) {
      Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&pixels);
      std::__cxx11::string::~string((string *)&outfilename);
      return;
    }
    uVar15 = lVar26 * 8;
    local_e8 = 8;
    for (lVar24 = 1; lVar24 != 3; lVar24 = lVar24 + 1) {
      poVar9 = std::operator<<((ostream *)&std::cout,"   x sampling ");
      iVar25 = (int)lVar26;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar25);
      poVar9 = std::operator<<(poVar9,", y sampling ");
      iVar23 = (int)lVar24;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar23);
      std::operator<<(poVar9,": writing image, ");
      std::ostream::flush();
      _Var5 = outfilename._M_dataplus;
      frameBuffer_1._map._M_t._M_impl._0_8_ = 0;
      Imf_3_2::Header::Header
                (&header,local_150,(int)uVar17,1.0,(Vec2 *)&frameBuffer_1,1.0,INCREASING_Y,
                 ZIP_COMPRESSION);
      puVar10 = (undefined4 *)Imf_3_2::Header::compression();
      *puVar10 = 4;
      pcVar11 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar25,iVar23,false);
      Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x19f8c3);
      pcVar11 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar25,iVar23,false);
      Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x19f8d6);
      pcVar11 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar25,iVar23,false);
      Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x19f8e9);
      pcVar11 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar25,iVar23,false);
      Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x1a9352);
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::OutputFile::OutputFile(&file,_Var5._M_p,&header,iVar6);
      pRVar13 = pixels._data;
      pixels2._sizeY = pixels2._sizeY & 0xffffffff00000000;
      pixels2._data = (Rgba *)0x0;
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,(char *)pixels._data,uVar15,0,iVar25,iVar23,0.0,false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&pixels2,(Slice *)0x19f8c3);
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,(char *)&pRVar13->g,uVar15,0,iVar25,iVar23,0.0,false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&pixels2,(Slice *)0x19f8d6);
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,(char *)&pRVar13->b,uVar15,0,iVar25,iVar23,0.0,false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&pixels2,(Slice *)0x19f8e9);
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,(char *)&pRVar13->a,uVar15,0,iVar25,iVar23,0.0,false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&pixels2,(Slice *)0x1a9352);
      uVar18 = uVar17 & 0xffffffff;
      if ((int)uVar17 < 1) {
        uVar18 = 0;
      }
      for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
        pRVar13 = pixels._data + pixels._sizeY * uVar17;
        lVar12 = Imf_3_2::FrameBuffer::operator[]((char *)&pixels2);
        *(Rgba **)(lVar12 + 8) = pRVar13;
        lVar12 = Imf_3_2::FrameBuffer::operator[]((char *)&pixels2);
        *(half **)(lVar12 + 8) = &pRVar13->g;
        lVar12 = Imf_3_2::FrameBuffer::operator[]((char *)&pixels2);
        *(half **)(lVar12 + 8) = &pRVar13->b;
        lVar12 = Imf_3_2::FrameBuffer::operator[]((char *)&pixels2);
        *(half **)(lVar12 + 8) = &pRVar13->a;
        Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&file);
        Imf_3_2::OutputFile::writePixels((int)&file);
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&pixels2);
      Imf_3_2::OutputFile::~OutputFile(&file);
      Imf_3_2::Header::~Header(&header);
      pixels2._sizeX = 1;
      pixels2._sizeY = 1;
      pixels2._data = (Rgba *)operator_new__(8);
      std::operator<<((ostream *)&std::cout,"reading back, ");
      std::ostream::flush();
      _Var5 = outfilename._M_dataplus;
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&file,_Var5._M_p,iVar6);
      Imf_3_2::InputFile::header();
      piVar7 = (int *)Imf_3_2::Header::dataWindow();
      iVar6 = *piVar7;
      iVar4 = piVar7[1];
      local_150 = (piVar7[2] - iVar6) + 1;
      uVar16 = (piVar7[3] - iVar4) + 1;
      uVar17 = (ulong)uVar16;
      Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase(&pixels2,(long)(int)uVar16,(long)(int)local_150);
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pRVar13 = pixels2._data + (-(long)iVar6 - (long)(int)(local_150 * iVar4));
      uVar18 = (ulong)(int)(iVar23 * local_150 * 8);
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,(char *)pRVar13,uVar15,uVar18,iVar25,iVar23,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x19f8c3);
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,(char *)&pRVar13->g,uVar15,uVar18,iVar25,iVar23,0.0,false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x19f8d6);
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,(char *)&pRVar13->b,uVar15,uVar18,iVar25,iVar23,0.0,false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x19f8e9);
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,(char *)&pRVar13->a,uVar15,uVar18,iVar25,iVar23,1.0,false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x1a9352);
      Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&file);
      Imf_3_2::InputFile::readPixels((int)&file,iVar4);
      std::operator<<((ostream *)&std::cout,"comparing, ");
      std::ostream::flush();
      pRVar13 = pixels._data;
      pRVar14 = pixels2._data;
      for (lVar12 = 0; lVar12 < (int)uVar16; lVar12 = lVar12 + lVar24) {
        lVar21 = local_e0;
        lVar22 = 6;
        while (lVar21 = lVar21 + lVar26, lVar21 < (int)local_150) {
          if (*(short *)((long)pRVar13 + lVar22 + -6) != *(short *)((long)pRVar14 + lVar22 + -6)) {
            __assert_fail("pixels2[y][x].r.bits () == pixels[y][x].r.bits ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                          ,0x90,
                          "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                         );
          }
          if (*(short *)((long)pRVar13 + lVar22 + -4) != *(short *)((long)pRVar14 + lVar22 + -4)) {
            __assert_fail("pixels2[y][x].g.bits () == pixels[y][x].g.bits ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                          ,0x91,
                          "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                         );
          }
          if (*(short *)((long)pRVar13 + lVar22 + -2) != *(short *)((long)pRVar14 + lVar22 + -2)) {
            __assert_fail("pixels2[y][x].b.bits () == pixels[y][x].b.bits ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                          ,0x92,
                          "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                         );
          }
          psVar1 = (short *)((long)&(pRVar13->r)._h + lVar22);
          psVar2 = (short *)((long)&(pRVar14->r)._h + lVar22);
          lVar22 = lVar22 + lVar8;
          if (*psVar1 != *psVar2) {
            __assert_fail("pixels2[y][x].a.bits () == pixels[y][x].a.bits ()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                          ,0x93,
                          "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                         );
          }
        }
        pRVar14 = (Rgba *)((long)&(pRVar14->r)._h + pixels2._sizeY * local_e8);
        pRVar13 = (Rgba *)((long)&(pRVar13->r)._h + pixels._sizeY * local_e8);
      }
      poVar9 = std::operator<<((ostream *)&std::cout,"ok");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::ostream::flush();
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&frameBuffer_1);
      Imf_3_2::InputFile::~InputFile((InputFile *)&file);
      remove(outfilename._M_dataplus._M_p);
      Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&pixels2);
      local_e8 = local_e8 + 8;
    }
    lVar26 = lVar26 + 1;
    lVar8 = lVar8 + 8;
    local_e0 = local_e0 + -1;
  } while( true );
}

Assistant:

void
readCopyRead (
    const std::string& tempDir,
    const char*        infilename,
    unsigned int       correctChecksum)
{
    std::string outfilename = tempDir + "imf_test_native.exr";

    int                                  w, h;
    Array2D<OPENEXR_IMF_NAMESPACE::Rgba> pixels (1, 1);

    cout << "   reading, " << flush;
    readImage (infilename, pixels, w, h, correctChecksum);
    cout << endl;

    for (int xs = 1; xs <= 2; ++xs)
    {
        for (int ys = 1; ys <= 2; ++ys)
        {
            cout << "   x sampling " << xs << ", y sampling " << ys
                 << ": writing image, " << flush;
            writeImage (outfilename.c_str (), pixels, w, h, xs, ys);

            Array2D<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (1, 1);
            cout << "reading back, " << flush;
            readBackImage (outfilename.c_str (), pixels2, pixels, w, h, xs, ys);

            remove (outfilename.c_str ());
        }
    }
}